

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float64_unordered_quiet_s390x(float64 a,float64 b,float_status *status)

{
  int iVar1;
  float64 a_00;
  float64 a_01;
  uint64_t uVar2;
  float_status *status_local;
  float64 b_local;
  float64 a_local;
  
  a_00 = float64_squash_input_denormal_s390x(a,status);
  a_01 = float64_squash_input_denormal_s390x(b,status);
  iVar1 = extractFloat64Exp(a_00);
  if (((iVar1 != 0x7ff) || (uVar2 = extractFloat64Frac(a_00), uVar2 == 0)) &&
     ((iVar1 = extractFloat64Exp(a_01), iVar1 != 0x7ff ||
      (uVar2 = extractFloat64Frac(a_01), uVar2 == 0)))) {
    return 0;
  }
  iVar1 = float64_is_signaling_nan_s390x(a_00,status);
  if ((iVar1 != 0) || (iVar1 = float64_is_signaling_nan_s390x(a_01,status), iVar1 != 0)) {
    float_raise_s390x('\x01',status);
  }
  return 1;
}

Assistant:

int float64_unordered_quiet(float64 a, float64 b, float_status *status)
{
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}